

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O2

void g_ptr_array_set_size(GPtrArray *array,gint length)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = array->len;
  if ((uint)length <= uVar1) {
    if ((uint)length <= uVar1 && uVar1 - length != 0) {
      g_ptr_array_remove_range(array,length,uVar1 - length);
    }
  }
  else {
    g_ptr_array_maybe_expand((GRealPtrArray *)array,length - uVar1);
    for (uVar2 = (ulong)array->len; uVar2 < (uint)length; uVar2 = uVar2 + 1) {
      array->pdata[uVar2] = (gpointer)0x0;
    }
  }
  array->len = length;
  return;
}

Assistant:

void g_ptr_array_set_size  (GPtrArray *array, gint length)
{
    GRealPtrArray *rarray = (GRealPtrArray *)array;
    guint length_unsigned;

    g_return_if_fail (rarray);
    g_return_if_fail (rarray->len == 0 || (rarray->len != 0 && rarray->pdata != NULL));
    g_return_if_fail (length >= 0);

    length_unsigned = (guint) length;

    if (length_unsigned > rarray->len)
    {
        guint i;
        g_ptr_array_maybe_expand (rarray, (length_unsigned - rarray->len));
        /* This is not 
         *     memset (array->pdata + array->len, 0,
         *            sizeof (gpointer) * (length_unsigned - array->len));
         * to make it really portable. Remember (void*)NULL needn't be
         * bitwise zero. It of course is silly not to use memset (..,0,..).
         */
        for (i = rarray->len; i < length_unsigned; i++)
            rarray->pdata[i] = NULL;
    }
    else if (length_unsigned < rarray->len)
        g_ptr_array_remove_range (array, length_unsigned, rarray->len - length_unsigned);

    rarray->len = length_unsigned;
}